

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3w.c
# Opt level: O0

int gl3wInit(void)

{
  int iVar1;
  
  open_libgl();
  load_procs();
  close_libgl();
  iVar1 = parse_version();
  return iVar1;
}

Assistant:

int gl3wInit(void)
{
	open_libgl();
	load_procs();
	close_libgl();
	return parse_version();
}